

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::SExpressionWasmBuilder::parseResults
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,
          SExpressionWasmBuilder *this,Element *s)

{
  bool bVar1;
  uintptr_t in_RAX;
  size_t sVar2;
  Element *s_00;
  size_t i;
  ulong uVar3;
  IString str;
  Type local_38;
  
  str.str._M_str = &s->isList_;
  str.str._M_len = RESULT._8_8_;
  local_38.id = in_RAX;
  bVar1 = elementStartsWith(s,str);
  if (bVar1) {
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar3 = 1;
    while( true ) {
      sVar2 = Element::size(s);
      if (sVar2 <= uVar3) break;
      s_00 = Element::operator[](s,(uint)uVar3);
      local_38 = elementToType(this,s_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                (__return_storage_ptr__,&local_38);
      uVar3 = uVar3 + 1;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("elementStartsWith(s, RESULT)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                ,0x284,"std::vector<Type> wasm::SExpressionWasmBuilder::parseResults(Element &)");
}

Assistant:

std::vector<Type> SExpressionWasmBuilder::parseResults(Element& s) {
  assert(elementStartsWith(s, RESULT));
  std::vector<Type> types;
  for (size_t i = 1; i < s.size(); i++) {
    types.push_back(elementToType(*s[i]));
  }
  return types;
}